

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependanceestimator.cxx
# Opt level: O1

void __thiscall DependanceEstimator::~DependanceEstimator(DependanceEstimator *this)

{
  long lVar1;
  
  (this->super_Estimator).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__DependanceEstimator_0015c8a0;
  if (this->aSamples != (double *)0x0) {
    operator_delete__(this->aSamples);
  }
  if (this->aOne != (double *)0x0) {
    operator_delete__(this->aOne);
  }
  if (this->aTwo != (double *)0x0) {
    operator_delete__(this->aTwo);
  }
  if (this->aThree != (double *)0x0) {
    operator_delete__(this->aThree);
  }
  if (this->aDist != (double **)0x0) {
    if (0 < this->dependanceBins) {
      lVar1 = 0;
      do {
        if (this->aDist[lVar1] != (double *)0x0) {
          operator_delete__(this->aDist[lVar1]);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 < this->dependanceBins);
    }
    if (this->aDist != (double **)0x0) {
      operator_delete__(this->aDist);
    }
  }
  Estimator::~Estimator(&this->super_Estimator);
  return;
}

Assistant:

DependanceEstimator::~DependanceEstimator()
{
	if (aSamples)
		delete[] aSamples;
	if (aOne)
		delete[] aOne;
	if (aTwo)
		delete[] aTwo;
	if (aThree)
		delete[] aThree;
	if (aDist) {
		for (int i=0; i<dependanceBins; ++i)
			delete[] aDist[i];
		delete[] aDist;
	}
}